

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  allocator<unsigned_char> *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  bool bVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bVar3;
  undefined1 local_1e8 [8];
  DateTimeData dtd1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Test;
  undefined1 local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dtd1Enc;
  undefined1 local_160 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Test;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> r2Enc;
  RegisterData r2;
  undefined1 local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Test;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> r1Enc;
  RegisterData r1;
  allocator<unsigned_char> local_ae;
  uchar local_ad [5];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> algClearTare;
  allocator<unsigned_char> local_5e;
  uchar local_5d [5];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> factoryReset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packet;
  char **argv_local;
  int argc_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  local_5d[0] = '\0';
  local_5d[1] = 0x40;
  local_5d[2] = 0;
  local_5d[3] = 0x10;
  local_5d[4] = 0x90;
  local_58 = local_5d;
  local_50 = 5;
  std::allocator<unsigned_char>::allocator(&local_5e);
  __l_03._M_len = local_50;
  __l_03._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,__l_03,&local_5e);
  std::allocator<unsigned_char>::~allocator(&local_5e);
  bVar3 = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ximu::PacketConstruction::
  constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (FACTORY_RESET,bVar3);
  bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &factoryReset.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  if (bVar2) {
    argv_local._4_4_ = 1;
    algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ad[0] = '\0';
    local_ad[1] = 0x40;
    local_ad[2] = 1;
    local_ad[3] = 0x71;
    local_ad[4] = 0x80;
    local_a8 = local_ad;
    local_a0 = 5;
    std::allocator<unsigned_char>::allocator(&local_ae);
    __l_02._M_len = local_a0;
    __l_02._M_array = local_a8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,__l_02,&local_ae);
    std::allocator<unsigned_char>::~allocator(&local_ae);
    bVar3 = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &factoryReset.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    ximu::PacketConstruction::
    constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (ALGORITHM_CLEAR_TARE,bVar3);
    bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &factoryReset.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    if (bVar2) {
      argv_local._4_4_ = 1;
      algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      ximu::RegisterData::RegisterData
                ((RegisterData *)
                 &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,ADXL_345C_SENSITIVITY_X,11.0);
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0x40;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0xc;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = 0x20;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = 0x16;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0xce;
      this = &r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)this);
      __l_01._M_len = 7;
      __l_01._M_array =
           (iterator)
           ((long)&r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,__l_01,
                 (allocator_type *)this);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 &r1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
      bVar3 = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
      ximu::PacketConstruction::
      constructWriteRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((RegisterData *)
                 &r1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,bVar3);
      bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      if (bVar2) {
        argv_local._4_4_ = 1;
        algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      else {
        ximu::RegisterData::RegisterData
                  ((RegisterData *)
                   &r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,BATTERY_SHUTDOWN_VOLTAGE);
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 9;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 4;
        r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0xd0;
        paVar1 = (allocator<unsigned_char> *)
                 ((long)&r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
        std::allocator<unsigned_char>::allocator(paVar1);
        __l_00._M_len = 5;
        __l_00._M_array =
             (iterator)
             ((long)&r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,__l_00,paVar1)
        ;
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&r2Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160);
        dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160)
        ;
        ximu::PacketConstruction::
        constructReadRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((RegisterData *)
                   &r2Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )dtd1Enc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
        if (bVar2) {
          argv_local._4_4_ = 1;
          algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        else {
          dtd1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 2;
          dtd1Test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0x45;
          paVar1 = (allocator<unsigned_char> *)
                   ((long)&dtd1Test.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 5);
          std::allocator<unsigned_char>::allocator(paVar1);
          __l._M_len = 10;
          __l._M_array = (iterator)
                         ((long)&dtd1Test.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,__l,paVar1);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     ((long)&dtd1Test.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds);
          ximu::DateTimeData::DateTimeData((DateTimeData *)local_1e8,0x7de,0xc,7,10,0x19,0x1e);
          bVar3 = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds
                            );
          ximu::PacketConstruction::
          constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((DateTimeData *)local_1e8,bVar3);
          bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180
                                  ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &dtd1._seconds);
          argv_local._4_4_ = (uint)bVar2;
          algClearTare.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtd1._seconds);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_160);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &factoryReset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  // the factory-reset command byte sequence has been extracted
  // from the c# gui application.
  // The test is to create the same byte sequence
  std::vector<unsigned char> packet;
  std::vector<unsigned char> factoryReset {0, 64, 0, 16, 144};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::FACTORY_RESET, back_inserter(packet));

  if (packet != factoryReset)
    return 1;

  // same test as the previous only now the command is the
  // algorithm clear tare command.
  packet.clear();
  std::vector<unsigned char> algClearTare {0, 64, 1, 113, 128};

  ximu::PacketConstruction::constructCommandPacket(
      ximu::CommandCodes::ALGORITHM_CLEAR_TARE, back_inserter(packet));

  if (packet != algClearTare)
    return 1;


  // Constucting RegisterData read/write 
  // write packet
  ximu::RegisterData r1(ximu::reg::RegisterAddresses::ADXL_345C_SENSITIVITY_X,11.0f);
  std::vector<unsigned char> r1Enc {1, 64, 12, 32,  22, 0, 206};	
  std::vector<unsigned char> r1Test;
  ximu::PacketConstruction::constructWriteRegisterPacket(r1,back_inserter(r1Test));

  if (r1Test != r1Enc)
    return 1;
  
  //read packet
  ximu::RegisterData r2(ximu::reg::RegisterAddresses::BATTERY_SHUTDOWN_VOLTAGE);
  std::vector<unsigned char> r2Enc {1, 0, 9, 4, 208};
  std::vector<unsigned char> r2Test;
  ximu::PacketConstruction::constructReadRegisterPacket(r2,back_inserter(r2Test));


  if (r2Test != r2Enc)
    return 1;

  // Constucting of the DateTimeData
  std::vector<unsigned char> dtd1Enc {2, 69, 2, 32, 56, 64, 74, 48, 75, 192};
  std::vector<unsigned char> dtd1Test;
  ximu::DateTimeData dtd1(2014, 12, 07, 10, 25, 30);
  ximu::PacketConstruction::constructWriteDateTimePacket(dtd1,back_inserter(dtd1Test));
  
  if (dtd1Enc != dtd1Test)
    return 1;
 
  
  
  return 0;
}